

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

void Cba_ManBoxNumRec_rec(Cba_Ntk_t *p,int *pCountP,int *pCountU)

{
  Vec_Int_t *p_00;
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Cba_Ntk_t *p_01;
  
  iVar2 = p->Id;
  if (pCountP[iVar2] < 0) {
    pCountU[iVar2] = 0;
    pCountP[iVar2] = 0;
    if (1 < (p->vObjType).nSize) {
      p_00 = &p->vObjFunc;
      lVar6 = 1;
      do {
        if ((p->vObjType).nSize <= lVar6) {
LAB_00330b6b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar1 = (p->vObjType).pArray[lVar6];
        if (cVar1 != '\0') {
          if (cVar1 == '\x03') {
            iVar3 = (int)lVar6;
            if ((p->vObjFunc).nSize < 1) {
              uVar4 = 0;
            }
            else {
              Vec_IntFillExtra(p_00,iVar3 + 1,0);
              if ((p->vObjFunc).nSize <= lVar6) goto LAB_00330b8a;
              uVar4 = (p->vObjFunc).pArray[lVar6];
            }
            if (((int)uVar4 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar4)) {
              p_01 = (Cba_Ntk_t *)0x0;
            }
            else {
              p_01 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[uVar4];
            }
            Cba_ManBoxNumRec_rec(p_01,pCountP,pCountU);
            if ((p->vObjType).nSize <= lVar6) goto LAB_00330b6b;
            if (((p->vObjType).pArray[lVar6] == '\x03') && (0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(p_00,iVar3 + 1,0);
              if ((p->vObjFunc).nSize <= lVar6) goto LAB_00330b8a;
              lVar5 = (long)(p->vObjFunc).pArray[lVar6];
            }
            else {
              lVar5 = 0;
            }
            pCountP[iVar2] = pCountP[iVar2] + pCountP[lVar5];
            if ((p->vObjType).nSize <= lVar6) goto LAB_00330b6b;
            if (((p->vObjType).pArray[lVar6] == '\x03') && (0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(p_00,iVar3 + 1,0);
              if ((p->vObjFunc).nSize <= lVar6) {
LAB_00330b8a:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              lVar5 = (long)(p->vObjFunc).pArray[lVar6];
            }
            else {
              lVar5 = 0;
            }
            pCountU[iVar2] = pCountU[lVar5] + pCountU[iVar2] + 1;
          }
          else {
            pCountP[iVar2] = pCountP[iVar2] + 1;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (p->vObjType).nSize);
    }
  }
  return;
}

Assistant:

static inline void Cba_ManBoxNumRec_rec( Cba_Ntk_t * p, int * pCountP, int * pCountU )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountP[Id] >= 0 )
        return;
    pCountP[Id] = pCountU[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_ManBoxNumRec_rec( Cba_ObjNtk(p, iObj), pCountP, pCountU );
            pCountP[Id] += pCountP[Cba_ObjNtkId(p, iObj)];
            pCountU[Id] += pCountU[Cba_ObjNtkId(p, iObj)] + 1;
        }
        else
            pCountP[Id] += 1;
    }
}